

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_gz.c
# Opt level: O3

void * nhr_gz_decompress(void *buff,size_t buff_size,size_t *decompressed_size,uchar method)

{
  int iVar1;
  void *mem;
  ulong uVar2;
  ulong new_size;
  z_stream zip;
  void *local_a8;
  ulong uStack_a0;
  undefined8 local_98;
  long lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (buff_size != 0 && buff != (void *)0x0) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    lStack_90 = 0;
    if (method == '\0') {
      uStack_a0 = buff_size & 0xffffffff;
      local_a8 = buff;
      iVar1 = inflateInit_(&local_a8,"1.2.11",0x70);
    }
    else {
      if (buff_size < 0x13) {
        return (void *)0x0;
      }
      if (*buff != '\x1f') {
        return (void *)0x0;
      }
      if (*(char *)((long)buff + 1) != -0x75) {
        return (void *)0x0;
      }
      uStack_a0 = (ulong)((int)buff_size - 0x12);
      local_a8 = (void *)((long)buff + 10);
      iVar1 = inflateInit2_(&local_a8,0xfffffff1,"1.2.11",0x70);
    }
    if (iVar1 == 0) {
      new_size = 0x200;
      mem = nhr_malloc(0x200);
      local_88._0_4_ = 0x200;
      uVar2 = 0;
      while( true ) {
        lStack_90 = (long)mem + uVar2;
        iVar1 = inflate(&local_a8,0);
        if ((iVar1 + 4U < 7) && ((0x47U >> (iVar1 + 4U & 0x1f) & 1) != 0)) break;
        if ((int)(0x200U - (int)local_88) < 1) {
          inflateEnd(&local_a8);
          nhr_free(mem);
          return (void *)0x0;
        }
        uVar2 = uVar2 + (0x200U - (int)local_88);
        if (new_size <= uVar2) {
          new_size = new_size + 0x200;
          mem = nhr_realloc(mem,new_size);
          local_88._0_4_ = 0x200;
        }
        if (iVar1 == 1) {
          inflateEnd(&local_a8);
          if (decompressed_size != (size_t *)0x0) {
            *decompressed_size = uVar2;
            return mem;
          }
          return mem;
        }
      }
      nhr_free(mem);
      inflateEnd(&local_a8);
    }
  }
  return (void *)0x0;
}

Assistant:

void * nhr_gz_decompress(const void * buff,
						 const size_t buff_size,
						 size_t * decompressed_size,
						 const unsigned char method) {
	z_stream zip;
	Bytef * out_buff = NULL;
	size_t writed = 0, out_size = NHR_GZ_CHUNK_SIZE;
	int available_size = 0, result = Z_ERRNO;

	if (!buff || buff_size == 0) {
		return NULL;
	}
	memset(&zip, 0, sizeof(z_stream));

	if (method == NHR_GZ_METHOD_DEFLATE) {
		zip.avail_in = (uInt)buff_size;
		zip.next_in = (Bytef *)buff;
		result = inflateInit(&zip);
	} else if (nhr_gz_is_gzip_file((Bytef *)buff, buff_size)) {
		zip.avail_in = (uInt)(buff_size - NHR_GZ_HEADER_FOOTER_SIZE);
		zip.next_in = (Bytef *)buff + NHR_GZ_HEADER_SIZE;
		result = inflateInit2(&zip, NHR_GZ_WINDOWS_BITS);
	}

	if (result != Z_OK) {
		return NULL;
	}

	out_buff = (Bytef *)nhr_malloc(NHR_GZ_CHUNK_SIZE);

	zip.avail_out = NHR_GZ_CHUNK_SIZE;

	do {
		zip.next_out = out_buff + writed;

		result = inflate(&zip, Z_NO_FLUSH);
		switch (result) {
			case Z_NEED_DICT:
				result = Z_DATA_ERROR;
			case Z_DATA_ERROR:
			case Z_MEM_ERROR:
			case Z_STREAM_ERROR:
				nhr_free(out_buff);
				inflateEnd(&zip);
				return NULL;
		}
		available_size = ((int)NHR_GZ_CHUNK_SIZE) - zip.avail_out;
		if (available_size > 0) {
			writed += available_size;
			if (writed < out_size) {
				zip.avail_out = ((int)NHR_GZ_CHUNK_SIZE) - available_size;
			} else {
				out_size += NHR_GZ_CHUNK_SIZE;
				out_buff = (Bytef *)nhr_realloc(out_buff, out_size);
				zip.avail_out = NHR_GZ_CHUNK_SIZE;
			}
		} else {
			inflateEnd(&zip);
			nhr_free(out_buff);
			return NULL;
		}
	} while (result != Z_STREAM_END);

	inflateEnd(&zip);

	if (decompressed_size) {
		*decompressed_size = writed;
	}
	return out_buff;
}